

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

void glfwInitAllocator(GLFWallocator *allocator)

{
  if (allocator == (GLFWallocator *)0x0) {
    _glfwInitAllocator.allocate._0_4_ = 0;
    _glfwInitAllocator.allocate._4_4_ = 0;
    _glfwInitAllocator.reallocate._0_4_ = 0;
    _glfwInitAllocator.reallocate._4_4_ = 0;
    _glfwInitAllocator.deallocate = (GLFWdeallocatefun)0x0;
    _glfwInitAllocator.user = (void *)0x0;
  }
  else {
    if (((allocator->allocate == (GLFWallocatefun)0x0) ||
        (allocator->reallocate == (GLFWreallocatefun)0x0)) ||
       (allocator->deallocate == (GLFWdeallocatefun)0x0)) {
      _glfwInputError(0x10004,"Missing function in allocator");
      return;
    }
    _glfwInitAllocator.allocate._0_4_ = *(undefined4 *)&allocator->allocate;
    _glfwInitAllocator.allocate._4_4_ = *(undefined4 *)((long)&allocator->allocate + 4);
    _glfwInitAllocator.reallocate._0_4_ = *(undefined4 *)&allocator->reallocate;
    _glfwInitAllocator.reallocate._4_4_ = *(undefined4 *)((long)&allocator->reallocate + 4);
    _glfwInitAllocator.deallocate = allocator->deallocate;
    _glfwInitAllocator.user = allocator->user;
  }
  return;
}

Assistant:

GLFWAPI void glfwInitAllocator(const GLFWallocator* allocator)
{
    if (allocator)
    {
        if (allocator->allocate && allocator->reallocate && allocator->deallocate)
            _glfwInitAllocator = *allocator;
        else
            _glfwInputError(GLFW_INVALID_VALUE, "Missing function in allocator");
    }
    else
        memset(&_glfwInitAllocator, 0, sizeof(GLFWallocator));
}